

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBColorMatrix(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,
                   int8_t *matrix_argb,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int8_t_ptr_int *ARGBColorMatrixRow;
  int y;
  code *pcVar2;
  int local_38;
  uint local_34;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  pcVar2 = ARGBColorMatrixRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
     (((int)in_R9D < 1 || ((int)ARGBColorMatrixRow == 0)))) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if ((int)ARGBColorMatrixRow < 0) {
      ARGBColorMatrixRow._0_4_ = -(int)ARGBColorMatrixRow;
      local_10 = in_RDI + ((int)ARGBColorMatrixRow + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_34 = in_R9D;
    local_24 = in_ECX;
    if ((local_14 == in_R9D << 2) && (in_ECX == in_R9D << 2)) {
      local_34 = (int)ARGBColorMatrixRow * in_R9D;
      ARGBColorMatrixRow._0_4_ = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && ((local_34 & 7) == 0)) {
      pcVar2 = ARGBColorMatrixRow_SSSE3;
    }
    local_20 = in_RDX;
    for (local_38 = 0; local_38 < (int)ARGBColorMatrixRow; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,in_R8,local_34);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBColorMatrix(const uint8_t* src_argb,
                    int src_stride_argb,
                    uint8_t* dst_argb,
                    int dst_stride_argb,
                    const int8_t* matrix_argb,
                    int width,
                    int height) {
  int y;
  void (*ARGBColorMatrixRow)(const uint8_t* src_argb, uint8_t* dst_argb,
                             const int8_t* matrix_argb, int width) =
      ARGBColorMatrixRow_C;
  if (!src_argb || !dst_argb || !matrix_argb || width <= 0 || height == 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBCOLORMATRIXROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 8)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_SSSE3;
  }
#endif
#if defined(HAS_ARGBCOLORMATRIXROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_NEON;
  }
#endif
#if defined(HAS_ARGBCOLORMATRIXROW_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(width, 2)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_MMI;
  }
#endif
#if defined(HAS_ARGBCOLORMATRIXROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBColorMatrixRow = ARGBColorMatrixRow_MSA;
  }
#endif
  for (y = 0; y < height; ++y) {
    ARGBColorMatrixRow(src_argb, dst_argb, matrix_argb, width);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}